

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall QWidgetPrivate::createExtra(QWidgetPrivate *this)

{
  undefined1 *puVar1;
  QWExtra *pQVar2;
  __uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_> __p;
  unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *this_00;
  long in_FS_OFFSET;
  __uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_> local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
      super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
      super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl == (QWExtra *)0x0) {
    this_00 = &this->extra;
    std::make_unique<QWExtra>();
    __p._M_t.super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
    super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl =
         local_20._M_t.super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
         super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
    local_20._M_t.super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
    super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl =
         (tuple<QWExtra_*,_std::default_delete<QWExtra>_>)
         (_Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>)0x0;
    std::__uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>::reset
              ((__uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_> *)this_00,
               (pointer)__p._M_t.super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                        super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl);
    std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::~unique_ptr
              ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)&local_20);
    ((this_00->_M_t).super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
     super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
     super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->glContext = (void *)0x0;
    ((this_00->_M_t).super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
     super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
     super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->proxyWidget =
         (QGraphicsProxyWidget *)0x0;
    pQVar2 = (this_00->_M_t).super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
             super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
             super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
    pQVar2->minw = 0;
    pQVar2->minh = 0;
    pQVar2->maxw = 0xffffff;
    pQVar2->maxh = 0xffffff;
    pQVar2->customDpiX = 0;
    pQVar2->customDpiY = 0;
    pQVar2->field_0x7c = pQVar2->field_0x7c & 0xfc;
    puVar1 = &((this_00->_M_t).super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
               super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
               super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->field_0x7c;
    *(ushort *)puVar1 = *(ushort *)puVar1 & 0xfff3;
    puVar1 = &((this_00->_M_t).super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
               super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
               super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->field_0x7c;
    *(ushort *)puVar1 = *(ushort *)puVar1 & 0xffef;
    puVar1 = &((this_00->_M_t).super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
               super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
               super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->field_0x7c;
    *(ushort *)puVar1 = *(ushort *)puVar1 & 0xffdf;
    puVar1 = &((this_00->_M_t).super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
               super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
               super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->field_0x7c;
    *(ushort *)puVar1 = *(ushort *)puVar1 & 0xffbf;
    puVar1 = &((this_00->_M_t).super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
               super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
               super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->field_0x7c;
    *(ushort *)puVar1 = *(ushort *)puVar1 & 0xfeff;
    puVar1 = &((this_00->_M_t).super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
               super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
               super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->field_0x7c;
    *(ushort *)puVar1 = *(ushort *)puVar1 & 0xff7f;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::createExtra()
{
    if (!extra) {                                // if not exists
        extra = std::make_unique<QWExtra>();
        extra->glContext = nullptr;
#if QT_CONFIG(graphicsview)
        extra->proxyWidget = nullptr;
#endif
        extra->minw = 0;
        extra->minh = 0;
        extra->maxw = QWIDGETSIZE_MAX;
        extra->maxh = QWIDGETSIZE_MAX;
        extra->customDpiX = 0;
        extra->customDpiY = 0;
        extra->explicitMinSize = 0;
        extra->explicitMaxSize = 0;
        extra->autoFillBackground = 0;
        extra->nativeChildrenForced = 0;
        extra->inRenderWithPainter = 0;
        extra->hasWindowContainer = false;
        extra->hasMask = 0;
        createSysExtra();
#ifdef QWIDGET_EXTRA_DEBUG
        static int count = 0;
        qDebug() << "extra" << ++count;
#endif
    }
}